

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_smooth_var(vector_t ***var,float32 **var_floor,uint32 n_mgau,uint32 n_stream,
                     uint32 n_density,uint32 *veclen)

{
  float fVar1;
  uint local_40;
  float32 flr;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen_local;
  uint32 n_density_local;
  uint32 n_stream_local;
  uint32 n_mgau_local;
  float32 **var_floor_local;
  vector_t ***var_local;
  
  for (l = 0; l < n_stream; l = l + 1) {
    for (local_40 = 0; local_40 < veclen[l]; local_40 = local_40 + 1) {
      fVar1 = (float)var_floor[l][local_40];
      for (k = 0; k < n_mgau; k = k + 1) {
        for (flr = 0.0; (uint)flr < n_density; flr = (float32)((int)flr + 1)) {
          if (var[k][l][(uint)flr][local_40] < fVar1) {
            var[k][l][(uint)flr][local_40] = fVar1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int
gauden_smooth_var(vector_t ***var,
		  float32 **var_floor,
		  uint32 n_mgau,
		  uint32 n_stream,
		  uint32 n_density,
		  const uint32 *veclen)
{
    uint32 i, j, k, l;
    float32 flr;
    
    for (j = 0; j < n_stream; j++) {
	for (l = 0; l < veclen[j]; l++) {

	    flr = var_floor[j][l];

	    for (i = 0; i < n_mgau; i++) {
		for (k = 0; k < n_density; k++) {
		    if (var[i][j][k][l] < flr) var[i][j][k][l] = flr;
		}
	    }
	}
    }

    return S3_SUCCESS;
}